

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int stream_is_destroyable(quicly_stream_t *stream)

{
  quicly_sender_state_t qVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = 0;
  if ((stream->recvstate).received.num_ranges == 0) {
    iVar2 = quicly_sendstate_transfer_complete(&stream->sendstate);
    uVar3 = 0;
    if (iVar2 != 0) {
      qVar1 = (stream->_send_aux).reset_stream.sender_state;
      uVar3 = (uint)(qVar1 == QUICLY_SENDER_STATE_ACKED || qVar1 == QUICLY_SENDER_STATE_NONE);
    }
  }
  return uVar3;
}

Assistant:

static int stream_is_destroyable(quicly_stream_t *stream)
{
    if (!quicly_recvstate_transfer_complete(&stream->recvstate))
        return 0;
    if (!quicly_sendstate_transfer_complete(&stream->sendstate))
        return 0;
    switch (stream->_send_aux.reset_stream.sender_state) {
    case QUICLY_SENDER_STATE_NONE:
    case QUICLY_SENDER_STATE_ACKED:
        break;
    default:
        return 0;
    }
    return 1;
}